

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O0

void sai_init_sparse_arrays(void)

{
  Integer i;
  long local_8;
  
  SPA = (_sparse_array *)malloc(0x640000);
  for (local_8 = 0; local_8 < 0x8000; local_8 = local_8 + 1) {
    SPA[local_8].active = 0;
    SPA[local_8].ready = 0;
    SPA[local_8].nblocks = 0;
    SPA[local_8].blkidx = (Integer *)0x0;
    SPA[local_8].blksize = (Integer *)0x0;
    SPA[local_8].offset = (Integer *)0x0;
    SPA[local_8].idx = (Integer *)0x0;
    SPA[local_8].jdx = (Integer *)0x0;
    SPA[local_8].val = (void *)0x0;
    SPA[local_8].max_nnz = 0;
    SPA[local_8].g_data = 999;
    SPA[local_8].g_i = 999;
    SPA[local_8].g_j = 999;
  }
  return;
}

Assistant:

void sai_init_sparse_arrays()
{
  Integer i;
  SPA = (_sparse_array*)malloc(MAX_ARRAYS*sizeof(_sparse_array));
  for (i=0; i<MAX_ARRAYS; i++) {
    SPA[i].active = 0;
    SPA[i].ready = 0;
    SPA[i].nblocks = 0;
    SPA[i].blkidx = NULL;
    SPA[i].blksize = NULL;
    SPA[i].offset = NULL;
    SPA[i].idx = NULL;
    SPA[i].jdx = NULL;
    SPA[i].val = NULL;
    SPA[i].max_nnz = 0;
    SPA[i].g_data = GA_OFFSET-1;
    SPA[i].g_i = GA_OFFSET-1;
    SPA[i].g_j = GA_OFFSET-1;
  }
}